

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase181::run(TestCase181 *this)

{
  ArrayDisposer *pAVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  TransformPromiseNodeBase *this_00;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  Promise<void> promise;
  uint lines;
  undefined4 uStack_dc;
  TransformPromiseNodeBase *local_d8;
  String trace;
  Own<kj::_::PromiseNode> local_b8;
  Own<kj::_::PromiseNode> local_a8;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::NeverDone::operator_cast_to_Promise((NeverDone *)&promise);
  iVar6 = 1000;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    trace.content.size_ = (size_t)promise.super_PromiseBase.node.disposer;
    trace.content.disposer = (ArrayDisposer *)promise.super_PromiseBase.node.ptr;
    promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    _::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_78,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:189:44),_kj::Promise<void>_>
               ::operator()<>);
    pAVar1 = trace.content.disposer;
    trace.content.disposer = (ArrayDisposer *)0x0;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a770;
    this_00[1].dependency.disposer = (Disposer *)trace.content.size_;
    this_00[1].dependency.ptr = (PromiseNode *)pAVar1;
    _lines = (Disposer *)
             &_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::TestCase181::run()::$_0,kj::Promise<void>>,kj::_::PropagateException>>
              ::instance;
    local_d8 = this_00;
    _::maybeChain<void>(&local_88,(Promise<void> *)&lines);
    pPVar3 = local_88.ptr;
    pDVar2 = local_88.disposer;
    local_b8.disposer = local_88.disposer;
    local_88.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_88);
    local_a8.disposer = pDVar2;
    local_a8.ptr = pPVar3;
    local_b8.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_b8);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&lines);
    Own<kj::_::PromiseNode>::dispose(&local_78);
    Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_a8);
    Own<kj::_::PromiseNode>::dispose(&local_a8);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&trace.content.size_);
  }
  EventLoop::run(&loop,0xffffffff);
  _::PromiseBase::trace(&trace,&promise.super_PromiseBase);
  _lines = (Disposer *)((ulong)_lines & 0xffffffff00000000);
  pcVar4 = trace.content.ptr + (trace.content.size_ - 1);
  if (trace.content.size_ == 0) {
    pcVar4 = (char *)0x0;
    trace.content.ptr = (char *)0x0;
  }
  uVar5 = 0;
  for (; trace.content.ptr != pcVar4; trace.content.ptr = trace.content.ptr + 1) {
    uVar5 = uVar5 + (*trace.content.ptr == '\n');
    _lines = (Disposer *)CONCAT44(uStack_dc,uVar5);
  }
  if ((4 < uVar5) && (_::Debug::minSeverity < 3)) {
    local_b8.disposer = (Disposer *)CONCAT44(local_b8.disposer._4_4_,5);
    _::Debug::log<char_const(&)[31],unsigned_int&,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0xcc,ERROR,"\"failed: expected \" \"(lines) < (5)\", lines, 5",
               (char (*) [31])"failed: expected (lines) < (5)",&lines,(int *)&local_b8);
  }
  Array<char>::~Array(&trace.content);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, DeepChain) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = NEVER_DONE;

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  loop.run();

  auto trace = promise.trace();
  uint lines = 0;
  for (char c: trace) {
    lines += c == '\n';
  }

  // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
  // 2-ish nodes.  We'll give a little room for implementation freedom.
  EXPECT_LT(lines, 5);
}